

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
Wrapper<CustomUintFormatter<8,false>,ServiceFlags_const&>::
Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
          (Wrapper<CustomUintFormatter<8,_false>,_const_ServiceFlags_&> *this,
          ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s)

{
  long lVar1;
  long in_FS_OFFSET;
  ServiceFlags in_stack_00000020;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *in_stack_00000028;
  CustomUintFormatter<8,_false> *in_stack_00000030;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CustomUintFormatter<8,false>::
  Ser<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,ServiceFlags>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const { Formatter().Ser(s, m_object); }